

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sine.cpp
# Opt level: O0

void __thiscall NaSineFunc::NaSineFunc(NaSineFunc *this,char *szOptions,NaVector *vInit)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *in_RSI;
  NaExternFunc *in_RDI;
  double dVar4;
  NaReal fTest;
  char *szRest;
  char *szO;
  char *szP;
  char *szF;
  char *szK;
  char *szTime;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_10;
  
  local_10 = in_RSI;
  NaExternFunc::NaExternFunc(in_RDI);
  pcVar1 = local_10;
  *(undefined ***)in_RDI = &PTR_PrintLog_00103d30;
  in_RDI[0x1c] = (NaExternFunc)0x0;
  *(undefined8 *)(in_RDI + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x28) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  local_20 = "time_arg";
  sVar3 = strlen("time_arg");
  iVar2 = strncmp(pcVar1,"time_arg",sVar3);
  pcVar1 = local_10;
  if (iVar2 == 0) {
    sVar3 = strlen(local_20);
    local_48 = pcVar1 + sVar3;
    if (*local_48 == '\0') {
      in_RDI[0x1c] = (NaExternFunc)0x1;
      local_28 = local_48;
    }
    else {
      iVar2 = isspace((int)*local_48);
      if (iVar2 == 0) {
        local_28 = local_10;
      }
      else {
        local_28 = local_48 + 1;
        in_RDI[0x1c] = (NaExternFunc)0x1;
      }
    }
  }
  else {
    local_28 = local_10;
  }
  dVar4 = strtod(local_28,&local_30);
  if (local_28 != local_30) {
    *(double *)(in_RDI + 0x20) = dVar4;
  }
  dVar4 = strtod(local_30,&local_38);
  if (local_30 != local_38) {
    *(double *)(in_RDI + 0x28) = dVar4;
  }
  dVar4 = strtod(local_38,&local_40);
  if (local_38 != local_40) {
    *(double *)(in_RDI + 0x30) = dVar4;
  }
  dVar4 = strtod(local_40,&local_48);
  if (local_40 != local_48) {
    *(double *)(in_RDI + 0x38) = dVar4;
  }
  return;
}

Assistant:

NaSineFunc::NaSineFunc (char* szOptions, NaVector& vInit)
  : bTime(false), fK(1.0), fF(1.0), fP(0.0), fO(0.0)
{
  const char	*szTime = "time_arg";
  char		*szK, *szF, *szP, *szO, *szRest;
  NaReal	fTest;

  if(!strncmp(szOptions, szTime, strlen(szTime)))
    {
      szRest = szOptions + strlen(szTime);
      if('\0' == *szRest) {
	szK = szRest;
	bTime = true;
      }
      else if(isspace(*szRest)) {
	szK = szRest + 1;
	bTime = true;
      }
      else
	szK = szOptions;
    }
  else
    szK = szOptions;

  fTest = strtod(szK, &szF);
  if(szK != szF)
    fK = fTest;

  fTest = strtod(szF, &szP);
  if(szF != szP)
    fF = fTest;

  fTest = strtod(szP, &szO);
  if(szP != szO)
    fP = fTest;

  fTest = strtod(szO, &szRest);
  if(szO != szRest)
    fO = fTest;
}